

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.c
# Opt level: O0

CURLMcode Curl_pipeline_set_site_blacklist(char **sites,curl_llist **list_ptr)

{
  curl_llist *list;
  int iVar1;
  char *__s;
  undefined8 *p;
  char *pcVar2;
  long lVar3;
  site_blacklist_entry *entry;
  char *port;
  char *hostname;
  curl_llist *new_list;
  curl_llist *old_list;
  curl_llist **list_ptr_local;
  char **sites_local;
  
  list = *list_ptr;
  hostname = (char *)0x0;
  if (sites != (char **)0x0) {
    hostname = (char *)Curl_llist_alloc(site_blacklist_llist_dtor);
    list_ptr_local = (curl_llist **)sites;
    if ((curl_llist *)hostname == (curl_llist *)0x0) {
      return CURLM_OUT_OF_MEMORY;
    }
    for (; *list_ptr_local != (curl_llist *)0x0; list_ptr_local = list_ptr_local + 1) {
      __s = (*Curl_cstrdup)((char *)*list_ptr_local);
      if (__s == (char *)0x0) {
        Curl_llist_destroy((curl_llist *)hostname,(void *)0x0);
        return CURLM_OUT_OF_MEMORY;
      }
      p = (undefined8 *)(*Curl_cmalloc)(0x10);
      if (p == (undefined8 *)0x0) {
        (*Curl_cfree)(__s);
        Curl_llist_destroy((curl_llist *)hostname,(void *)0x0);
        return CURLM_OUT_OF_MEMORY;
      }
      pcVar2 = strchr(__s,0x3a);
      if (pcVar2 == (char *)0x0) {
        *(undefined2 *)(p + 1) = 0x50;
      }
      else {
        *pcVar2 = '\0';
        lVar3 = strtol(pcVar2 + 1,(char **)0x0,10);
        *(short *)(p + 1) = (short)lVar3;
      }
      *p = __s;
      iVar1 = Curl_llist_insert_next((curl_llist *)hostname,((curl_llist *)hostname)->tail,p);
      if (iVar1 == 0) {
        site_blacklist_llist_dtor((void *)0x0,p);
        Curl_llist_destroy((curl_llist *)hostname,(void *)0x0);
        return CURLM_OUT_OF_MEMORY;
      }
    }
  }
  if (list != (curl_llist *)0x0) {
    Curl_llist_destroy(list,(void *)0x0);
  }
  *list_ptr = (curl_llist *)hostname;
  return CURLM_OK;
}

Assistant:

CURLMcode Curl_pipeline_set_site_blacklist(char **sites,
                                           struct curl_llist **list_ptr)
{
  struct curl_llist *old_list = *list_ptr;
  struct curl_llist *new_list = NULL;

  if(sites) {
    new_list = Curl_llist_alloc((curl_llist_dtor) site_blacklist_llist_dtor);
    if(!new_list)
      return CURLM_OUT_OF_MEMORY;

    /* Parse the URLs and populate the list */
    while(*sites) {
      char *hostname;
      char *port;
      struct site_blacklist_entry *entry;

      hostname = strdup(*sites);
      if(!hostname) {
        Curl_llist_destroy(new_list, NULL);
        return CURLM_OUT_OF_MEMORY;
      }

      entry = malloc(sizeof(struct site_blacklist_entry));
      if(!entry) {
        free(hostname);
        Curl_llist_destroy(new_list, NULL);
        return CURLM_OUT_OF_MEMORY;
      }

      port = strchr(hostname, ':');
      if(port) {
        *port = '\0';
        port++;
        entry->port = (unsigned short)strtol(port, NULL, 10);
      }
      else {
        /* Default port number for HTTP */
        entry->port = 80;
      }

      entry->hostname = hostname;

      if(!Curl_llist_insert_next(new_list, new_list->tail, entry)) {
        site_blacklist_llist_dtor(NULL, entry);
        Curl_llist_destroy(new_list, NULL);
        return CURLM_OUT_OF_MEMORY;
      }

      sites++;
    }
  }

  /* Free the old list */
  if(old_list) {
    Curl_llist_destroy(old_list, NULL);
  }

  /* This might be NULL if sites == NULL, i.e the blacklist is cleared */
  *list_ptr = new_list;

  return CURLM_OK;
}